

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O1

void cf2_builder_moveTo(CF2_OutlineCallbacks callbacks,CF2_CallbackParams params)

{
  PS_Builder *builder;
  
  builder = (PS_Builder *)callbacks[1].moveTo;
  ps_builder_close_contour(builder);
  builder->path_begun = '\0';
  return;
}

Assistant:

static void
  cf2_builder_moveTo( CF2_OutlineCallbacks      callbacks,
                      const CF2_CallbackParams  params )
  {
    /* downcast the object pointer */
    CF2_Outline  outline = (CF2_Outline)callbacks;
    PS_Builder*  builder;

    (void)params;        /* only used in debug mode */


    FT_ASSERT( outline && outline->decoder );
    FT_ASSERT( params->op == CF2_PathOpMoveTo );

    builder = &outline->decoder->builder;

    /* note: two successive moves simply close the contour twice */
    ps_builder_close_contour( builder );
    builder->path_begun = 0;
  }